

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  cmGeneratedFileStream *pcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  bool bVar4;
  bool bVar5;
  Encoding EVar6;
  int iVar7;
  ostream *poVar8;
  cmCustomCommand *this_02;
  string *psVar9;
  pointer ppcVar10;
  cmGeneratedFileStream *this_03;
  char *pcVar11;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string compilerDependTimestamp;
  string compilerDependFile;
  string dependFileNameFull;
  string depsUseCompiler;
  cmAlphaNum local_528;
  cmGeneratedFileStream depFileStream;
  cmGeneratedFileStream timestampFileStream;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&depFileStream,"CMAKE_MAKE_INCLUDE_FROM_ROOT",
             (allocator<char> *)&timestampFileStream);
  bVar4 = cmMakefile::IsOn(this_00,(string *)&depFileStream);
  pcVar11 = "";
  if (bVar4) {
    pcVar11 = "$(CMAKE_BINARY_DIR)/";
  }
  std::__cxx11::string::~string((string *)&depFileStream);
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)(this->TargetBuildDirectoryFull)._M_string_length;
  timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)0xc;
  timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       anon_var_dwarf_17bbc48;
  cmStrCat<>(&dependFileNameFull,(cmAlphaNum *)&depFileStream,(cmAlphaNum *)&timestampFileStream);
  poVar8 = std::operator<<((ostream *)
                           (this->BuildFileStream)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                           "# Include any dependencies generated for this target.\n");
  poVar8 = std::operator<<(poVar8,(string *)&this->GlobalGenerator->IncludeDirective);
  poVar8 = std::operator<<(poVar8," ");
  poVar8 = std::operator<<(poVar8,pcVar11);
  cmOutputConverter::MaybeRelativeToTopBinDir
            ((string *)&timestampFileStream,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,&dependFileNameFull);
  cmSystemTools::ConvertToOutputPath((string *)&depFileStream,(string *)&timestampFileStream);
  poVar8 = std::operator<<(poVar8,(string *)&depFileStream);
  std::operator<<(poVar8,"\n");
  std::__cxx11::string::~string((string *)&depFileStream);
  std::__cxx11::string::~string((string *)&timestampFileStream);
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)&depFileStream,this);
  cmGeneratorTarget::GetCustomCommands(this_01,&customCommands,(string *)&depFileStream);
  std::__cxx11::string::~string((string *)&depFileStream);
  ppcVar2 = customCommands.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar3 = customCommands.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppcVar10 = ppcVar3;
    if (ppcVar10 == ppcVar2) break;
    this_02 = cmSourceFile::GetCustomCommand(*ppcVar10);
    psVar9 = cmCustomCommand::GetDepfile_abi_cxx11_(this_02);
    ppcVar3 = ppcVar10 + 1;
  } while (psVar9->_M_string_length == 0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&depsUseCompiler,"CMAKE_DEPENDS_USE_COMPILER",
             (allocator<char> *)&depFileStream);
  if (this->GlobalGenerator->ToolSupportsCompilerDependencies == true) {
    bVar5 = cmMakefile::IsDefinitionSet
                      ((this->super_cmCommonTargetGenerator).Makefile,&depsUseCompiler);
    bVar4 = true;
    if ((bVar5) &&
       (bVar4 = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&depsUseCompiler),
       ppcVar10 == ppcVar2 && !bVar4)) goto LAB_0042237f;
LAB_0042201c:
    depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
    depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream = (_func_int **)(this->TargetBuildDirectoryFull)._M_string_length;
    timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream = (_func_int **)0x15;
    timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         anon_var_dwarf_17bbca3;
    cmStrCat<>(&compilerDependFile,(cmAlphaNum *)&depFileStream,(cmAlphaNum *)&timestampFileStream);
    poVar8 = std::operator<<((ostream *)
                             (this->BuildFileStream)._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                             "# Include any dependencies generated by the compiler for this target.\n"
                            );
    poVar8 = std::operator<<(poVar8,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar11);
    cmOutputConverter::MaybeRelativeToTopBinDir
              ((string *)&timestampFileStream,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&compilerDependFile);
    cmSystemTools::ConvertToOutputPath((string *)&depFileStream,(string *)&timestampFileStream);
    poVar8 = std::operator<<(poVar8,(string *)&depFileStream);
    std::operator<<(poVar8,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream);
    std::__cxx11::string::~string((string *)&timestampFileStream);
    EVar6 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(&depFileStream,&compilerDependFile,false,EVar6);
    poVar8 = std::operator<<((ostream *)&depFileStream,
                             "# Empty compiler generated dependencies file for ");
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    poVar8 = std::operator<<(poVar8,".\n");
    std::operator<<(poVar8,"# This may be replaced when dependencies are built.\n");
    timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
    timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream = (_func_int **)(this->TargetBuildDirectoryFull)._M_string_length;
    local_528.View_._M_len = 0x19;
    local_528.View_._M_str = "/compiler_depend.internal";
    cmStrCat<>(&compilerDependTimestamp,(cmAlphaNum *)&timestampFileStream,&local_528);
    cmsys::SystemTools::RemoveFile(&compilerDependTimestamp);
    std::__cxx11::string::~string((string *)&compilerDependTimestamp);
    timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
    timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream = (_func_int **)(this->TargetBuildDirectoryFull)._M_string_length;
    local_528.View_._M_len = (size_t)&DAT_00000013;
    local_528.View_._M_str = "/compiler_depend.ts";
    cmStrCat<>(&compilerDependTimestamp,(cmAlphaNum *)&timestampFileStream,&local_528);
    bVar5 = cmsys::SystemTools::FileExists(&compilerDependTimestamp);
    if (!bVar5) {
      EVar6 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[5])();
      cmGeneratedFileStream::cmGeneratedFileStream
                (&timestampFileStream,&compilerDependTimestamp,false,EVar6);
      poVar8 = std::operator<<((ostream *)&timestampFileStream,
                               "# CMAKE generated file: DO NOT EDIT!\n");
      poVar8 = std::operator<<(poVar8,
                               "# Timestamp file for compiler generated dependencies management for "
                              );
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->super_cmCommonTargetGenerator).GeneratorTarget);
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      std::operator<<(poVar8,".\n");
      cmGeneratedFileStream::~cmGeneratedFileStream(&timestampFileStream);
    }
    std::__cxx11::string::~string((string *)&compilerDependTimestamp);
    cmGeneratedFileStream::~cmGeneratedFileStream(&depFileStream);
    std::__cxx11::string::~string((string *)&compilerDependFile);
    if (bVar4 == false) goto LAB_0042237f;
    EVar6 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(&depFileStream,&dependFileNameFull,false,EVar6);
    poVar8 = std::operator<<((ostream *)&depFileStream,"# Empty dependencies file for ");
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    poVar8 = std::operator<<(poVar8,".\n");
    std::operator<<(poVar8,"# This may be replaced when dependencies are built.\n");
    timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
    timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream = (_func_int **)(this->TargetBuildDirectoryFull)._M_string_length;
    local_528.View_._M_len = (size_t)&DAT_00000010;
    local_528.View_._M_str = "/depend.internal";
    cmStrCat<>(&compilerDependFile,(cmAlphaNum *)&timestampFileStream,&local_528);
    cmsys::SystemTools::RemoveFile(&compilerDependFile);
    std::__cxx11::string::~string((string *)&compilerDependFile);
  }
  else {
    if (ppcVar10 != ppcVar2) {
      bVar4 = false;
      goto LAB_0042201c;
    }
LAB_0042237f:
    bVar4 = cmsys::SystemTools::FileExists(&dependFileNameFull);
    if (bVar4) goto LAB_00422406;
    EVar6 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(&depFileStream,&dependFileNameFull,false,EVar6);
    poVar8 = std::operator<<((ostream *)&depFileStream,"# Empty dependencies file for ");
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    poVar8 = std::operator<<(poVar8,".\n");
    std::operator<<(poVar8,"# This may be replaced when dependencies are built.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&depFileStream);
LAB_00422406:
  if (this->NoRuleMessages == false) {
    poVar8 = std::operator<<((ostream *)
                             (this->BuildFileStream)._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                             "# Include the progress variables for this target.\n");
    poVar8 = std::operator<<(poVar8,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar11);
    cmOutputConverter::MaybeRelativeToTopBinDir
              ((string *)&timestampFileStream,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&this->ProgressFileNameFull);
    cmSystemTools::ConvertToOutputPath((string *)&depFileStream,(string *)&timestampFileStream);
    poVar8 = std::operator<<(poVar8,(string *)&depFileStream);
    std::operator<<(poVar8,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream);
    std::__cxx11::string::~string((string *)&timestampFileStream);
  }
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)(this->TargetBuildDirectoryFull)._M_string_length;
  timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)&DAT_0000000b;
  timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       anon_var_dwarf_1803556;
  cmStrCat<>((string *)&local_528,(cmAlphaNum *)&depFileStream,(cmAlphaNum *)&timestampFileStream);
  psVar9 = &this->FlagFileNameFull;
  std::__cxx11::string::operator=((string *)psVar9,(string *)&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  local_528.View_._M_len = local_528.View_._M_len & 0xffffffffffffff00;
  iVar7 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[5])();
  timestampFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream =
       (_func_int **)
       CONCAT44(timestampFileStream.super_ofstream.
                super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._4_4_,iVar7);
  std::make_unique<cmGeneratedFileStream,std::__cxx11::string&,bool,codecvt::Encoding>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&depFileStream,
             (bool *)psVar9,(Encoding *)&local_528);
  this_03 = (cmGeneratedFileStream *)
            depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream;
  depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)0x0;
  pcVar1 = (this->FlagFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  (this->FlagFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = this_03;
  if (pcVar1 != (cmGeneratedFileStream *)0x0) {
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))(pcVar1);
    if (depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream != (_func_int **)0x0) {
      (**(code **)(*depFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream + 8))();
    }
    this_03 = (this->FlagFileStream)._M_t.
              super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
              .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  }
  if (this_03 != (cmGeneratedFileStream *)0x0) {
    cmGeneratedFileStream::SetCopyIfDifferent(this_03,true);
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,
               (ostream *)
               (this->FlagFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl);
    poVar8 = std::operator<<((ostream *)
                             (this->BuildFileStream)._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                             "# Include the compile flags for this target\'s objects.\n");
    poVar8 = std::operator<<(poVar8,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,pcVar11);
    cmOutputConverter::MaybeRelativeToTopBinDir
              ((string *)&timestampFileStream,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar9);
    cmSystemTools::ConvertToOutputPath((string *)&depFileStream,(string *)&timestampFileStream);
    poVar8 = std::operator<<(poVar8,(string *)&depFileStream);
    std::operator<<(poVar8,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream);
    std::__cxx11::string::~string((string *)&timestampFileStream);
  }
  std::__cxx11::string::~string((string *)&depsUseCompiler);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
  std::__cxx11::string::~string((string *)&dependFileNameFull);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                        ? "$(CMAKE_BINARY_DIR)/"
                        : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, "/depend.make");
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeRelativeToTopBinDir(dependFileNameFull))
    << "\n";

  // Scan any custom commands to check if DEPFILE option is specified
  bool ccGenerateDeps = false;
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands,
                                           this->GetConfigName());
  for (cmSourceFile const* sf : customCommands) {
    if (!sf->GetCustomCommand()->GetDepfile().empty()) {
      ccGenerateDeps = true;
      break;
    }
  }

  std::string depsUseCompiler = "CMAKE_DEPENDS_USE_COMPILER";
  bool compilerGenerateDeps =
    this->GlobalGenerator->SupportsCompilerDependencies() &&
    (!this->Makefile->IsDefinitionSet(depsUseCompiler) ||
     this->Makefile->IsOn(depsUseCompiler));

  if (compilerGenerateDeps || ccGenerateDeps) {
    std::string compilerDependFile =
      cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.make");
    *this->BuildFileStream << "# Include any dependencies generated by the "
                              "compiler for this target.\n"
                           << this->GlobalGenerator->IncludeDirective << " "
                           << root
                           << cmSystemTools::ConvertToOutputPath(
                                this->LocalGenerator->MaybeRelativeToTopBinDir(
                                  compilerDependFile))
                           << "\n\n";

    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(
      compilerDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# Empty compiler generated dependencies file for "
                  << this->GeneratorTarget->GetName() << ".\n"
                  << "# This may be replaced when dependencies are built.\n";
    // remove internal dependency file
    cmSystemTools::RemoveFile(
      cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.internal"));

    std::string compilerDependTimestamp =
      cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.ts");
    if (!cmSystemTools::FileExists(compilerDependTimestamp)) {
      // Write a dependency timestamp file.
      cmGeneratedFileStream timestampFileStream(
        compilerDependTimestamp, false,
        this->GlobalGenerator->GetMakefileEncoding());
      timestampFileStream
        << "# CMAKE generated file: DO NOT EDIT!\n"
        << "# Timestamp file for compiler generated dependencies "
           "management for "
        << this->GeneratorTarget->GetName() << ".\n";
    }
  }

  if (compilerGenerateDeps) {
    // deactivate no longer needed legacy dependency files
    // Write an empty dependency file.
    cmGeneratedFileStream legacyDepFileStream(
      dependFileNameFull, false, this->GlobalGenerator->GetMakefileEncoding());
    legacyDepFileStream
      << "# Empty dependencies file for " << this->GeneratorTarget->GetName()
      << ".\n"
      << "# This may be replaced when dependencies are built.\n";
    // remove internal dependency file
    cmSystemTools::RemoveFile(
      cmStrCat(this->TargetBuildDirectoryFull, "/depend.internal"));
  } else {
    // make sure the depend file exists
    if (!cmSystemTools::FileExists(dependFileNameFull)) {
      // Write an empty dependency file.
      cmGeneratedFileStream depFileStream(
        dependFileNameFull, false,
        this->GlobalGenerator->GetMakefileEncoding());
      depFileStream << "# Empty dependencies file for "
                    << this->GeneratorTarget->GetName() << ".\n"
                    << "# This may be replaced when dependencies are built.\n";
    }
  }

  if (!this->NoRuleMessages) {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator->MaybeRelativeToTopBinDir(
             this->ProgressFileNameFull))
      << "\n\n";
  }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, "/flags.make");
  this->FlagFileStream = cm::make_unique<cmGeneratedFileStream>(
    this->FlagFileNameFull, false,
    this->GlobalGenerator->GetMakefileEncoding());
  if (!this->FlagFileStream) {
    return;
  }
  this->FlagFileStream->SetCopyIfDifferent(true);
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeRelativeToTopBinDir(
           this->FlagFileNameFull))
    << "\n\n";
}